

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O2

void __thiscall slang::ast::Compilation::noteCannotCache(Compilation *this,Scope *scope)

{
  Symbol *instanceBody;
  InstanceSideEffects *pIVar1;
  
  do {
    instanceBody = scope->thisSym;
    if (instanceBody->kind == InstanceBody) {
      pIVar1 = getOrAddSideEffects(this,instanceBody);
      if (pIVar1->cannotCache != false) {
        return;
      }
      pIVar1->cannotCache = true;
    }
    scope = Symbol::getHierarchicalParent(instanceBody);
  } while (scope != (Scope *)0x0);
  return;
}

Assistant:

void Compilation::noteCannotCache(const Scope& scope) {
    auto currScope = &scope;
    do {
        auto& symbol = currScope->asSymbol();
        if (symbol.kind == SymbolKind::InstanceBody) {
            auto& entry = getOrAddSideEffects(symbol);
            if (entry.cannotCache)
                break;

            entry.cannotCache = true;
        }

        currScope = symbol.getHierarchicalParent();
    } while (currScope);
}